

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::RePost(cmCursesMainForm *this)

{
  FORM *form;
  cmState *pcVar1;
  bool bVar2;
  FIELD **ppFVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_> *pvVar7;
  long lVar8;
  pointer ppcVar9;
  allocator local_79;
  string local_78;
  string local_58;
  ulong local_38;
  
  form = (this->super_cmCursesForm).Form;
  if (form != (FORM *)0x0) {
    unpost_form((FORM_conflict *)form);
    free_form((FORM_conflict *)(this->super_cmCursesForm).Form);
    (this->super_cmCursesForm).Form = (FORM *)0x0;
  }
  if (this->Fields != (FIELD **)0x0) {
    operator_delete__(this->Fields);
  }
  if (this->AdvancedMode == true) {
    this->NumberOfVisibleEntries =
         (long)(this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  else {
    this->NumberOfVisibleEntries = 0;
    ppcVar9 = (this->Entries->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (ppcVar9 !=
        (this->Entries->
        super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        pcVar1 = this->CMakeInstance->State;
        pcVar5 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
        std::__cxx11::string::string((string *)&local_78,pcVar5,(allocator *)&local_58);
        pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        pcVar1 = this->CMakeInstance->State;
        pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
        std::__cxx11::string::string((string *)&local_78,pcVar6,&local_79);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ADVANCED","");
        bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_78,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        if ((pcVar5 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
          this->NumberOfVisibleEntries = this->NumberOfVisibleEntries + 1;
        }
        ppcVar9 = ppcVar9 + 1;
      } while (ppcVar9 !=
               (this->Entries->
               super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (this->NumberOfVisibleEntries == 0) {
    this->NumberOfVisibleEntries = 1;
  }
  lVar8 = this->NumberOfVisibleEntries * 3;
  ppFVar3 = (FIELD **)operator_new__(-(ulong)(lVar8 + 1U >> 0x3d != 0) | (lVar8 + 1U) * 8);
  this->Fields = ppFVar3;
  if (lVar8 != -1) {
    lVar4 = 0;
    do {
      this->Fields[lVar4] = (FIELD *)0x0;
      lVar4 = lVar4 + 1;
    } while (lVar8 + 1 != lVar4);
  }
  pvVar7 = this->Entries;
  ppcVar9 = (pvVar7->
            super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (ppcVar9 ==
      (pvVar7->
      super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
  }
  else {
    local_38 = 0;
    do {
      pcVar1 = this->CMakeInstance->State;
      pcVar5 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
      std::__cxx11::string::string((string *)&local_78,pcVar5,(allocator *)&local_58);
      pcVar5 = cmState::GetCacheEntryValue(pcVar1,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pcVar1 = this->CMakeInstance->State;
      pcVar6 = cmCursesCacheEntryComposite::GetValue(*ppcVar9);
      std::__cxx11::string::string((string *)&local_78,pcVar6,&local_79);
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ADVANCED","");
      bVar2 = cmState::GetCacheEntryPropertyAsBool(pcVar1,&local_78,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((pcVar5 != (char *)0x0) && ((!bVar2 || (this->AdvancedMode != false)))) {
        lVar8 = (long)((int)local_38 * 3);
        this->Fields[lVar8] = ((*ppcVar9)->Label->super_cmCursesWidget).Field;
        this->Fields[lVar8 + 1] = ((*ppcVar9)->IsNewLabel->super_cmCursesWidget).Field;
        this->Fields[lVar8 + 2] = (*ppcVar9)->Entry->Field;
        local_38 = (ulong)((int)local_38 + 1);
      }
      ppcVar9 = ppcVar9 + 1;
      pvVar7 = this->Entries;
    } while (ppcVar9 !=
             (pvVar7->
             super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = (int)local_38 == 0;
  }
  if (bVar2) {
    ppcVar9 = (pvVar7->
              super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    *this->Fields = ((*ppcVar9)->Label->super_cmCursesWidget).Field;
    this->Fields[1] = ((*ppcVar9)->IsNewLabel->super_cmCursesWidget).Field;
    this->Fields[2] = (*ppcVar9)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
  }
  this->Fields[this->NumberOfVisibleEntries * 3] = (FIELD *)0x0;
  return;
}

Assistant:

void cmCursesMainForm::RePost()
{
  // Create the fields to be passed to the form.
  if (this->Form)
    {
    unpost_form(this->Form);
    free_form(this->Form);
    this->Form = 0;
    }
  delete[] this->Fields;
  if (this->AdvancedMode)
    {
    this->NumberOfVisibleEntries = this->Entries->size();
    }
  else
    {
    // If normal mode, count only non-advanced entries
    this->NumberOfVisibleEntries = 0;
    std::vector<cmCursesCacheEntryComposite*>::iterator it;
    for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
      {
      const char* existingValue =
          this->CMakeInstance->GetState()
              ->GetCacheEntryValue((*it)->GetValue());
      bool advanced =
          this->CMakeInstance->GetState()
              ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
      if (!existingValue || (!this->AdvancedMode && advanced))
        {
        continue;
        }
      this->NumberOfVisibleEntries++;
      }
    }
  // there is always one even if it is the dummy one
  if(this->NumberOfVisibleEntries == 0)
    {
    this->NumberOfVisibleEntries = 1;
    }
  // Assign the fields: 3 for each entry: label, new entry marker
  // ('*' or ' ') and entry widget
  this->Fields = new FIELD*[3*this->NumberOfVisibleEntries+1];
  size_t cc;
  for ( cc = 0; cc < 3 * this->NumberOfVisibleEntries+1; cc ++ )
    {
    this->Fields[cc] = 0;
    }

  // Assign fields
  int j=0;
  std::vector<cmCursesCacheEntryComposite*>::iterator it;
  for (it = this->Entries->begin(); it != this->Entries->end(); ++it)
    {
    const char* existingValue =
        this->CMakeInstance->GetState()
            ->GetCacheEntryValue((*it)->GetValue());
    bool advanced =
        this->CMakeInstance->GetState()
            ->GetCacheEntryPropertyAsBool((*it)->GetValue(), "ADVANCED");
    if (!existingValue || (!this->AdvancedMode && advanced))
      {
      continue;
      }
    this->Fields[3*j]    = (*it)->Label->Field;
    this->Fields[3*j+1]  = (*it)->IsNewLabel->Field;
    this->Fields[3*j+2]  = (*it)->Entry->Field;
    j++;
    }
  // if no cache entries there should still be one dummy field
  if(j == 0)
    {
    it = this->Entries->begin();
    this->Fields[0]    = (*it)->Label->Field;
    this->Fields[1]  = (*it)->IsNewLabel->Field;
    this->Fields[2]  = (*it)->Entry->Field;
    this->NumberOfVisibleEntries = 1;
    }
  // Has to be null terminated.
  this->Fields[3*this->NumberOfVisibleEntries] = 0;
}